

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O0

Result_Type *
chaiscript::detail::Cast_Helper<const_std::function<chaiscript::Boxed_Value_()>_&>::cast
          (Boxed_Value *ob,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  function<chaiscript::Boxed_Value_()> *__x;
  Type_Conversions_State *in_RSI;
  Result_Type *in_RDI;
  function<chaiscript::Boxed_Value_()> *in_stack_ffffffffffffffd0;
  Result_Type *bv;
  
  bv = in_RDI;
  __x = (function<chaiscript::Boxed_Value_()> *)Boxed_Value::get_type_info((Boxed_Value *)0x438d79);
  user_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>();
  bVar1 = Type_Info::bare_equal((Type_Info *)in_stack_ffffffffffffffd0,(Type_Info *)__x);
  if (bVar1) {
    chaiscript::dispatch::functor<chaiscript::Boxed_Value()>((Boxed_Value *)bv,in_RSI);
  }
  else {
    Cast_Helper_Inner<const_std::function<chaiscript::Boxed_Value_()>_&>::cast
              ((Boxed_Value *)in_stack_ffffffffffffffd0,(Type_Conversions_State *)__x);
    std::function<chaiscript::Boxed_Value_()>::function(in_stack_ffffffffffffffd0,__x);
  }
  return in_RDI;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *t_conversions)
        {
          if (ob.get_type_info().bare_equal(user_type<Const_Proxy_Function>()))
          {
            return dispatch::functor<Signature>(ob, t_conversions);
          } else {
            return Cast_Helper_Inner<const std::function<Signature> &>::cast(ob, t_conversions);
          }
        }